

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O3

bool __thiscall
QHstsHeaderParser::processDirective(QHstsHeaderParser *this,QByteArray *name,QByteArray *value)

{
  bool bVar1;
  int iVar2;
  CutResult CVar3;
  undefined1 *puVar4;
  storage_type *originalLength;
  char *pcVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  storage_type *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = (name->d).ptr;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)&QByteArray::_empty;
  }
  iVar2 = qstrnicmp(pcVar5,(name->d).size,"max-age",7);
  if (iVar2 == 0) {
    if (this->maxAgeFound == false) {
      pcVar5 = (value->d).ptr;
      originalLength = (storage_type *)(value->d).size;
      if (originalLength < (storage_type *)0x2) {
LAB_00173fab:
        if (originalLength == (storage_type *)0x0) goto LAB_00173f46;
      }
      else if (*pcVar5 == '\"') {
        local_40 = originalLength + -2;
        local_38 = (undefined1 *)0x1;
        CVar3 = QtPrivate::QContainerImplHelper::mid
                          ((qsizetype)originalLength,(qsizetype *)&local_38,(qsizetype *)&local_40);
        if (CVar3 == Null) goto LAB_00173f46;
        pcVar5 = pcVar5 + (long)local_38;
        originalLength = local_40;
        goto LAB_00173fab;
      }
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QVar6.m_data = originalLength;
      QVar6.m_size = (qsizetype)&local_38;
      QtPrivate::toSignedInteger(QVar6,(int)pcVar5);
      bVar1 = false;
      puVar4 = local_38;
      if (((ulong)puStack_30 & 1) != 0) {
        puVar4 = (undefined1 *)0x0;
      }
      if (-1 < (long)puVar4 && ((ulong)puStack_30 & 1) == 0) {
        this->maxAge = (qint64)puVar4;
        this->maxAgeFound = true;
        bVar1 = true;
      }
      goto LAB_00173f48;
    }
  }
  else {
    pcVar5 = (name->d).ptr;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    iVar2 = qstrnicmp(pcVar5,(name->d).size,"includesubdomains",0x11);
    bVar1 = true;
    if (iVar2 != 0) goto LAB_00173f48;
    if (this->subDomainsFound == false) {
      this->subDomainsFound = true;
      goto LAB_00173f48;
    }
  }
LAB_00173f46:
  bVar1 = false;
LAB_00173f48:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QHstsHeaderParser::processDirective(const QByteArray &name, const QByteArray &value)
{
    Q_ASSERT(name.size());
    // RFC6797 6.1/3 Directive names are case-insensitive
    if (name.compare("max-age", Qt::CaseInsensitive) == 0) {
        // RFC 6797, 6.1.1
        // The syntax of the max-age directive's REQUIRED value (after
        // quoted-string unescaping, if necessary) is defined as:
        //
        // max-age-value = delta-seconds
        if (maxAgeFound) {
            // RFC 6797, 6.1/2:
            // All directives MUST appear only once in an STS header field.
            return false;
        }

        const QByteArrayView unescapedValue = unescapeMaxAge(value);
        if (!unescapedValue.size())
            return false;

        bool ok = false;
        const qint64 age = unescapedValue.toLongLong(&ok);
        if (!ok || age < 0)
            return false;

        maxAge = age;
        maxAgeFound = true;
    } else if (name.compare("includesubdomains", Qt::CaseInsensitive) == 0) {
        // RFC 6797, 6.1.2.  The includeSubDomains Directive.
        // The OPTIONAL "includeSubDomains" directive is a valueless directive.

        if (subDomainsFound) {
            // RFC 6797, 6.1/2:
            // All directives MUST appear only once in an STS header field.
            return false;
        }

        subDomainsFound = true;
    } // else we do nothing, skip unknown directives (RFC 6797, 6.1/5)

    return true;
}